

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::reserve
          (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *this,size_t n)

{
  Half *pHVar1;
  iterator pHVar2;
  ulong in_RSI;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *in_RDI;
  int i;
  Half *ra;
  Half *in_stack_ffffffffffffffc8;
  polymorphic_allocator<pbrt::Half> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (in_RDI->nAlloc < in_RSI) {
    pHVar1 = pmr::polymorphic_allocator<pbrt::Half>::allocate_object<pbrt::Half>
                       (in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 = (polymorphic_allocator<pbrt::Half> *)(pHVar1 + local_1c);
      pHVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::Half>::construct<pbrt::Half,pbrt::Half>
                (&in_RDI->alloc,(Half *)in_stack_ffffffffffffffd0,pHVar2 + local_1c);
      pHVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::Half>::destroy<pbrt::Half>(&in_RDI->alloc,pHVar2 + local_1c);
    }
    pmr::polymorphic_allocator<pbrt::Half>::deallocate_object<pbrt::Half>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x523871);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = pHVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }